

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_simul.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *__nptr;
  uint64_t *puVar1;
  char **ppcVar2;
  ulong *puVar3;
  ulong uVar4;
  uint64_t *t;
  undefined1 __s1 [8];
  int iVar5;
  int extraout_EAX;
  char *pcVar6;
  char *pcVar7;
  int *piVar8;
  ulong uVar9;
  FILE *__stream;
  long lVar10;
  os_thread_t *poVar11;
  param_t *ppVar12;
  ulong uVar13;
  long lVar14;
  char *__s1_00;
  param_t *p;
  ulonglong uVar15;
  void *arg;
  char **ppcVar16;
  uint64_t *puVar17;
  undefined1 auStack_20068 [8];
  os_thread_t th [4096];
  rng_t rng;
  void *local_38;
  uint64_t ndummies;
  
  pcVar6 = argv[1];
  if (pcVar6 == (char *)0x0) goto LAB_0010471e;
  dir = pcVar6;
  if ((*pcVar6 == '.') || (pcVar6 = strchr(pcVar6,0x2f), pcVar6 != (char *)0x0)) {
    pcVar6 = argv[2];
    if (pcVar6 != (char *)0x0) {
      ppcVar16 = argv + 2;
      do {
        pcVar7 = strchr(pcVar6,0x3d);
        if (pcVar7 == (char *)0x0) goto LAB_001046e7;
        if (pcVar7[1] == '\0') goto LAB_001046df;
        __nptr = pcVar7 + 1;
        __s1_00 = "n_threads";
        ppVar12 = params;
        while ((iVar5 = strncmp(__s1_00,pcVar6,(long)pcVar7 - (long)pcVar6), iVar5 != 0 ||
               (__s1_00[(long)pcVar7 - (long)pcVar6] != '\0'))) {
          __s1_00 = ppVar12[1].name;
          ppVar12 = ppVar12 + 1;
          if (__s1_00 == (char *)0x0) {
            main_cold_2();
            goto LAB_001046ca;
          }
        }
        puVar17 = ppVar12->var;
        if (puVar17 == (uint64_t *)0x0) {
          iVar5 = strcmp(__s1_00,"latency_file");
          if (iVar5 != 0) goto LAB_0010470e;
        }
        else {
          ppcVar2 = ppVar12->enums;
          if (ppcVar2 == (char **)0x0) {
            piVar8 = __errno_location();
            *piVar8 = 0;
            uVar15 = strtoull(__nptr,(char **)auStack_20068,0);
            __s1 = auStack_20068;
            if (*piVar8 != 0) goto LAB_00104713;
            if (*(char *)auStack_20068 != '\0') {
              iVar5 = strcmp((char *)auStack_20068,"K");
              if ((iVar5 == 0) || (iVar5 = strcmp((char *)__s1,"KB"), iVar5 == 0)) {
                uVar15 = uVar15 << 10;
              }
              else {
                iVar5 = strcmp((char *)__s1,"M");
                if ((iVar5 == 0) || (iVar5 = strcmp((char *)__s1,"MB"), iVar5 == 0)) {
                  uVar15 = uVar15 << 0x14;
                }
                else {
                  iVar5 = strcmp((char *)__s1,"G");
                  if ((iVar5 == 0) || (iVar5 = strcmp((char *)__s1,"GB"), iVar5 == 0)) {
                    uVar15 = uVar15 << 0x1e;
                  }
                  else {
                    iVar5 = strcmp((char *)__s1,"T");
                    if ((iVar5 != 0) && (iVar5 = strcmp((char *)__s1,"TB"), iVar5 != 0))
                    goto LAB_00104741;
                    uVar15 = uVar15 << 0x28;
                  }
                }
              }
            }
          }
          else {
            if (*ppcVar2 == (char *)0x0) {
LAB_001046ca:
              main_cold_3();
              goto LAB_001046d5;
            }
            iVar5 = strcasecmp(__nptr,*ppcVar2);
            uVar15 = 0;
            while (iVar5 != 0) {
              if (ppcVar2[uVar15 + 1] == (char *)0x0) goto LAB_001046ca;
              iVar5 = strcasecmp(__nptr,ppcVar2[uVar15 + 1]);
              uVar15 = uVar15 + 1;
            }
          }
          if (uVar15 < ppVar12->min) goto LAB_001046ef;
          if (ppVar12->max < uVar15) goto LAB_001046fd;
          *puVar17 = uVar15;
          __nptr = latency_file;
        }
        latency_file = __nptr;
        pcVar6 = ppcVar16[1];
        ppcVar16 = ppcVar16 + 1;
      } while (pcVar6 != (char *)0x0);
    }
    if (n_threads == 0) {
      uVar9 = sysconf(0x54);
      uVar9 = uVar9 & 0xffffffff;
      n_threads = 0x1000;
      if (uVar9 < 0x1000) {
        n_threads = uVar9;
      }
      if (uVar9 == 0) goto LAB_0010473c;
    }
    if (max_size < min_size) goto LAB_00104723;
    printf("Parameters:\n  %-20s : %s\n","dir",dir);
    ppVar12 = params;
    pcVar6 = "n_threads";
    do {
      puVar3 = ppVar12->var;
      if (puVar3 != (ulong *)0x0) {
        printf("  %-20s : ",pcVar6);
        ppcVar16 = ppVar12->enums;
        if (ppcVar16 == (char **)0x0) {
          uVar9 = *puVar3;
          if (uVar9 == 0xffffffffffffffff) {
            printf(anon_var_dwarf_5c1);
          }
          else {
            if ((uVar9 & 0x3ff) == 0 && uVar9 != 0) {
              lVar10 = 0;
              uVar13 = uVar9;
              do {
                uVar9 = uVar13 >> 10;
                lVar10 = lVar10 + 1;
                if (uVar13 == 0) break;
                uVar4 = uVar13 & 0xffc00;
                uVar13 = uVar9;
              } while (uVar4 == 0);
            }
            else {
              lVar10 = 0;
            }
            printf("%lu%s",uVar9,(long)&DAT_001066a0 + (long)(int)(&DAT_001066a0)[lVar10]);
          }
        }
        else {
          pcVar6 = (char *)0xffffffffffffffff;
          do {
            pcVar7 = pcVar6 + 1;
            pcVar6 = pcVar6 + 1;
          } while (ppcVar16[(long)pcVar7] != (char *)0x0);
          pcVar7 = (char *)*puVar3;
          if (pcVar7 < pcVar6) {
            pcVar7 = ppcVar16[(long)pcVar7];
            pcVar6 = "%s";
          }
          else {
            pcVar6 = "enum out of range: %lu";
          }
          printf(pcVar6,pcVar7);
        }
        putchar(10);
      }
      pcVar6 = ppVar12[1].name;
      ppVar12 = ppVar12 + 1;
    } while (pcVar6 != (char *)0x0);
    lotta_zeroes = mmap((void *)0x0,max_size,1,0x8022,-1,0);
    if (lotta_zeroes == (void *)0x0) goto LAB_00104728;
    randomize_r((rng_t *)((long)th + 0x1fff8),seed);
    vsize_seed = rnd64_r((rng_t *)((long)th + 0x1fff8));
    os_cond_init(&ready.cond);
    os_mutex_init(&ready.mutex);
    ready.wanted = n_threads;
    cache = (VMEMcache *)vmemcache_new();
    vmemcache_set_size(cache,cache_size);
    vmemcache_set_extent_size(cache,cache_extent_size);
    vmemcache_set_eviction_policy(cache,(undefined4)repl_policy);
    iVar5 = vmemcache_add(cache,dir);
    if (iVar5 != 0) goto LAB_0010472d;
    if (latency_samples == 0) {
LAB_001043a0:
      if (junk_start != 0) {
        puts("Pre-filling the cache with junk...");
        memset(auStack_20068,0x21,0x100);
        vmemcache_callback_on_evict(cache,on_evict_cb,0);
        local_38 = (void *)0x0;
        if (cache_is_full == '\0') {
          do {
            local_38 = (void *)((long)local_38 + 1);
            vmemcache_put(cache,&local_38,8,auStack_20068,0x100);
          } while (cache_is_full != '\x01');
        }
        vmemcache_callback_on_evict(cache,0,0);
      }
      vmemcache_bench_set(cache,0,type == 0);
      vmemcache_bench_set(cache,2,1);
      if (warm_up != 0) {
        vmemcache_bench_set(cache,3,1);
      }
      puts("Spawning threads...");
      if (n_threads != 0) {
        poVar11 = (os_thread_t *)auStack_20068;
        arg = (void *)0x0;
        do {
          iVar5 = os_thread_create(poVar11,(os_thread_attr_t *)0x0,worker,arg);
          if (iVar5 != 0) goto LAB_001046d5;
          arg = (void *)((long)arg + 1);
          poVar11 = poVar11 + 1;
        } while (arg < n_threads);
      }
      if (n_threads == 0) {
        uVar9 = 0;
      }
      else {
        poVar11 = (os_thread_t *)auStack_20068;
        uVar13 = 0;
        uVar9 = 0;
        do {
          iVar5 = os_thread_join(poVar11,&local_38);
          if (iVar5 != 0) goto LAB_001046da;
          uVar9 = uVar9 + (long)local_38;
          uVar13 = uVar13 + 1;
          poVar11 = poVar11 + 1;
        } while (uVar13 < n_threads);
      }
      puts("Done.");
      print_stats(cache);
      if (latencies != (uint64_t *)0x0) {
        __stream = _stdout;
        if ((latency_file != (char *)0x0) &&
           (__stream = fopen(latency_file,"w"), __stream == (FILE *)0x0)) {
          main_cold_15();
          __stream = _stdout;
        }
        qsort(latencies,ops_count * n_threads,8,cmp_u64);
        t = latencies;
        latencies[n_threads * ops_count] = 0xffffffffffffffff;
        puVar17 = t + -1;
        lVar10 = -8;
        do {
          lVar10 = lVar10 + 8;
          puVar1 = puVar17 + 1;
          puVar17 = puVar17 + 1;
        } while (-1 < (long)*puVar1);
        lVar14 = ops_count * n_threads;
        print_ntiles((FILE *)__stream,t,lVar10 >> 3);
        print_ntiles((FILE *)__stream,puVar17,lVar14 - (lVar10 >> 3));
        if (latency_file != (char *)0x0) {
          fclose(__stream);
        }
      }
      vmemcache_delete(cache);
      printf("Total time: %lu.%09lu s\n",uVar9 / 1000000000,uVar9 % 1000000000);
      uVar9 = (uVar9 / n_threads) / ops_count;
      printf(anon_var_dwarf_68e,uVar9 / 1000,uVar9 % 1000);
      free(latencies);
      return 0;
    }
    lVar10 = n_threads * ops_count;
    latencies = (uint64_t *)malloc(lVar10 * 8 + 8);
    if (latencies != (uint64_t *)0x0) {
      latencies[lVar10] = 0xffffffffffffffff;
      goto LAB_001043a0;
    }
    goto LAB_00104732;
  }
  goto LAB_00104737;
LAB_001046d5:
  main_cold_13();
LAB_001046da:
  main_cold_14();
LAB_001046df:
  main_cold_9();
LAB_001046e7:
  main_cold_10();
LAB_001046ef:
  main_cold_7();
LAB_001046fd:
  main_cold_6();
LAB_0010470e:
  main_cold_8();
LAB_00104713:
  main_cold_4();
LAB_0010471e:
  main_cold_19();
LAB_00104723:
  main_cold_17();
LAB_00104728:
  main_cold_16();
LAB_0010472d:
  main_cold_11();
LAB_00104732:
  main_cold_12();
LAB_00104737:
  main_cold_1();
LAB_0010473c:
  main_cold_18();
LAB_00104741:
  main_cold_5();
  cache_is_full = 1;
  return extraout_EAX;
}

Assistant:

int
main(int argc, const char **argv)
{
	parse_args(argv + 1);

	if (!n_threads) {
		n_threads = (uint32_t)sysconf(_SC_NPROCESSORS_ONLN);
		if (n_threads > MAX_THREADS)
			n_threads = MAX_THREADS;
		if (!n_threads)
			UT_FATAL("can't obtain number of processor cores");
	}

	if (min_size > max_size)
		UT_FATAL("min_size > max_size");

	printf("Parameters:\n  %-20s : %s\n", "dir", dir);
	for (struct param_t *p = params; p->name; p++) {
		if (!p->var)
			continue;

		printf("  %-20s : ", p->name);
		if (p->enums) {
			uint64_t nvalid = 0;
			for (; p->enums[nvalid]; nvalid++)
				;

			if (*p->var < nvalid)
				printf("%s", p->enums[*p->var]);
			else
				printf("enum out of range: %lu", *p->var);
		} else
			print_units(*p->var);
		printf("\n");
	}

	lotta_zeroes = mmap(NULL, max_size, PROT_READ,
		MAP_PRIVATE | MAP_ANONYMOUS | MAP_POPULATE, -1, 0);
	if (!lotta_zeroes) {
		UT_FATAL("couldn't grab a zero buffer: mmap failed: %s",
			strerror(errno));
	}

	run_bench();

	return 0;
}